

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  undefined8 uVar5;
  int last;
  char *pcVar6;
  undefined8 uVar7;
  REF_LIST ref_list;
  REF_LIST original;
  REF_MPI ref_mpi;
  REF_LIST local_38;
  undefined8 local_30;
  REF_MPI local_28;
  
  uVar2 = ref_mpi_start(argc,argv);
  if (uVar2 != 0) {
    pcVar6 = "start";
    uVar5 = 0x20;
LAB_00102235:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           uVar5,"main",(ulong)uVar2,pcVar6);
    return uVar2;
  }
  uVar2 = ref_mpi_create(&local_28);
  if (uVar2 != 0) {
    pcVar6 = "make mpi";
    uVar5 = 0x21;
    goto LAB_00102235;
  }
  RVar3 = ref_list_free((REF_LIST)0x0);
  if (RVar3 != 2) {
    lVar4 = (long)RVar3;
    pcVar6 = "dont free NULL";
    uVar7 = 2;
    uVar5 = 0x24;
    goto LAB_001022b8;
  }
  uVar2 = ref_list_create(&local_38);
  if (uVar2 != 0) {
    pcVar6 = "create";
    uVar5 = 0x25;
    goto LAB_00102235;
  }
  lVar4 = (long)local_38->n;
  if (lVar4 == 0) {
    uVar2 = ref_list_free(local_38);
    if (uVar2 != 0) {
      pcVar6 = "free";
      uVar5 = 0x27;
      goto LAB_00102235;
    }
    uVar2 = ref_list_create((REF_LIST *)&local_30);
    if (uVar2 != 0) {
      pcVar6 = "create";
      uVar5 = 0x2c;
      goto LAB_00102235;
    }
    uVar2 = ref_list_deep_copy(&local_38,(REF_LIST)CONCAT44(local_30._4_4_,(int)local_30));
    if (uVar2 != 0) {
      pcVar6 = "deep copy";
      uVar5 = 0x2d;
      goto LAB_00102235;
    }
    uVar2 = ref_list_free((REF_LIST)CONCAT44(local_30._4_4_,(int)local_30));
    if (uVar2 != 0) {
      pcVar6 = "free";
      uVar5 = 0x2e;
      goto LAB_00102235;
    }
    uVar2 = ref_list_free(local_38);
    if (uVar2 != 0) {
      pcVar6 = "free";
      uVar5 = 0x2f;
      goto LAB_00102235;
    }
    uVar2 = ref_list_create(&local_38);
    if (uVar2 != 0) {
      pcVar6 = "create";
      uVar5 = 0x34;
      goto LAB_00102235;
    }
    uVar2 = ref_list_push(local_38,0x1b);
    if (uVar2 != 0) {
      pcVar6 = "add";
      uVar5 = 0x36;
      goto LAB_00102235;
    }
    lVar4 = (long)local_38->n;
    if (lVar4 != 1) {
      pcVar6 = "has one";
      uVar7 = 1;
      uVar5 = 0x37;
      goto LAB_001022b8;
    }
    uVar2 = ref_list_free(local_38);
    if (uVar2 != 0) {
      pcVar6 = "free";
      uVar5 = 0x38;
      goto LAB_00102235;
    }
    uVar2 = ref_list_create(&local_38);
    if (uVar2 != 0) {
      pcVar6 = "create";
      uVar5 = 0x3d;
      goto LAB_00102235;
    }
    RVar3 = ref_list_pop(local_38,(REF_INT *)&local_30);
    if (RVar3 != 1) {
      lVar4 = (long)RVar3;
      pcVar6 = "rm";
      uVar7 = 1;
      uVar5 = 0x3f;
      goto LAB_001022b8;
    }
    uVar2 = ref_list_push(local_38,0x1b);
    if (uVar2 != 0) {
      pcVar6 = "add";
      uVar5 = 0x42;
      goto LAB_00102235;
    }
    uVar2 = ref_list_pop(local_38,(REF_INT *)&local_30);
    if (uVar2 != 0) {
      pcVar6 = "rm";
      uVar5 = 0x43;
      goto LAB_00102235;
    }
    lVar4 = (long)local_38->n;
    if (lVar4 == 0) {
      uVar2 = ref_list_free(local_38);
      if (uVar2 != 0) {
        pcVar6 = "free";
        uVar5 = 0x46;
        goto LAB_00102235;
      }
      uVar2 = ref_list_create(&local_38);
      if (uVar2 != 0) {
        pcVar6 = "create";
        uVar5 = 0x4b;
        goto LAB_00102235;
      }
      iVar1 = local_38->max;
      if (iVar1 < 0) {
LAB_001026e5:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
               ,0x50,"main","more?");
        return 1;
      }
      last = 0;
      do {
        uVar2 = ref_list_push(local_38,last);
        if (uVar2 != 0) {
          pcVar6 = "store";
          uVar5 = 0x4e;
          goto LAB_00102235;
        }
        last = last + 1;
      } while (iVar1 + 1 != last);
      if (local_38->max <= iVar1) goto LAB_001026e5;
      uVar2 = ref_list_free(local_38);
      if (uVar2 != 0) {
        pcVar6 = "free";
        uVar5 = 0x51;
        goto LAB_00102235;
      }
      uVar2 = ref_list_create(&local_38);
      if (uVar2 != 0) {
        pcVar6 = "create";
        uVar5 = 0x55;
        goto LAB_00102235;
      }
      uVar2 = ref_list_push(local_38,0x14);
      if (uVar2 != 0) {
        pcVar6 = "store";
        uVar5 = 0x56;
        goto LAB_00102235;
      }
      uVar2 = ref_list_push(local_38,10);
      if (uVar2 != 0) {
        pcVar6 = "store";
        uVar5 = 0x57;
        goto LAB_00102235;
      }
      uVar2 = ref_list_erase(local_38);
      if (uVar2 != 0) {
        pcVar6 = "rm -rf";
        uVar5 = 0x59;
        goto LAB_00102235;
      }
      lVar4 = (long)local_38->n;
      if (lVar4 == 0) {
        uVar2 = ref_list_free(local_38);
        if (uVar2 != 0) {
          pcVar6 = "free";
          uVar5 = 0x5d;
          goto LAB_00102235;
        }
        uVar2 = ref_list_create(&local_38);
        if (uVar2 != 0) {
          pcVar6 = "create";
          uVar5 = 99;
          goto LAB_00102235;
        }
        uVar2 = ref_list_push(local_38,0x1b);
        if (uVar2 != 0) {
          pcVar6 = "add";
          uVar5 = 0x65;
          goto LAB_00102235;
        }
        uVar2 = ref_list_contains(local_38,0x1b,(REF_BOOL *)&local_30);
        if (uVar2 != 0) {
          pcVar6 = "have";
          uVar5 = 0x66;
          goto LAB_00102235;
        }
        lVar4 = (long)(int)local_30;
        if (lVar4 != 1) {
          pcVar6 = "does have";
          uVar7 = 1;
          uVar5 = 0x67;
          goto LAB_001022b8;
        }
        uVar2 = ref_list_contains(local_38,5,(REF_BOOL *)&local_30);
        if (uVar2 != 0) {
          pcVar6 = "have";
          uVar5 = 0x68;
          goto LAB_00102235;
        }
        lVar4 = (long)(int)local_30;
        if (lVar4 == 0) {
          uVar2 = ref_list_free(local_38);
          if (uVar2 != 0) {
            pcVar6 = "free";
            uVar5 = 0x6a;
            goto LAB_00102235;
          }
          uVar2 = ref_list_create(&local_38);
          if (uVar2 != 0) {
            pcVar6 = "create";
            uVar5 = 0x6f;
            goto LAB_00102235;
          }
          RVar3 = ref_list_delete(local_38,5);
          if (RVar3 != 5) {
            lVar4 = (long)RVar3;
            pcVar6 = "rm";
            uVar7 = 5;
            uVar5 = 0x72;
            goto LAB_001022b8;
          }
          uVar2 = ref_list_push(local_38,0x15);
          if (uVar2 != 0) {
            pcVar6 = "add";
            uVar5 = 0x75;
            goto LAB_00102235;
          }
          uVar2 = ref_list_push(local_38,0x16);
          if (uVar2 != 0) {
            pcVar6 = "add";
            uVar5 = 0x77;
            goto LAB_00102235;
          }
          uVar2 = ref_list_push(local_38,0x17);
          if (uVar2 != 0) {
            pcVar6 = "add";
            uVar5 = 0x79;
            goto LAB_00102235;
          }
          lVar4 = (long)local_38->n;
          if (lVar4 != 3) {
            pcVar6 = "has 3";
            uVar7 = 3;
            uVar5 = 0x7a;
            goto LAB_001022b8;
          }
          uVar2 = ref_list_delete(local_38,0x15);
          if (uVar2 != 0) {
            pcVar6 = "have";
            uVar5 = 0x7d;
            goto LAB_00102235;
          }
          lVar4 = (long)local_38->n;
          if (lVar4 != 2) {
            pcVar6 = "has 2";
            uVar7 = 2;
            uVar5 = 0x7e;
            goto LAB_001022b8;
          }
          uVar2 = ref_list_delete(local_38,0x17);
          if (uVar2 != 0) {
            pcVar6 = "have";
            uVar5 = 0x81;
            goto LAB_00102235;
          }
          lVar4 = (long)local_38->n;
          if (lVar4 != 1) {
            pcVar6 = "has 1";
            uVar7 = 1;
            uVar5 = 0x82;
            goto LAB_001022b8;
          }
          uVar2 = ref_list_delete(local_38,0x16);
          if (uVar2 != 0) {
            pcVar6 = "have";
            uVar5 = 0x85;
            goto LAB_00102235;
          }
          lVar4 = (long)local_38->n;
          if (lVar4 == 0) {
            uVar2 = ref_list_free(local_38);
            if (uVar2 == 0) {
              uVar2 = ref_mpi_free(local_28);
              if (uVar2 == 0) {
                uVar2 = ref_mpi_stop();
                if (uVar2 == 0) {
                  return 0;
                }
                pcVar6 = "stop";
                uVar5 = 0x8c;
              }
              else {
                pcVar6 = "mpi free";
                uVar5 = 0x8b;
              }
            }
            else {
              pcVar6 = "free";
              uVar5 = 0x88;
            }
            goto LAB_00102235;
          }
          pcVar6 = "has 0";
          uVar5 = 0x86;
        }
        else {
          pcVar6 = "does have";
          uVar5 = 0x69;
        }
      }
      else {
        pcVar6 = "has none";
        uVar5 = 0x5b;
      }
    }
    else {
      pcVar6 = "has none";
      uVar5 = 0x44;
    }
  }
  else {
    pcVar6 = "init zero";
    uVar5 = 0x26;
  }
  uVar7 = 0;
LAB_001022b8:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",uVar5
         ,"main",pcVar6,uVar7,lVar4);
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
  REF_LIST ref_list;
  REF_MPI ref_mpi;
  RSS(ref_mpi_start(argc, argv), "start");
  RSS(ref_mpi_create(&ref_mpi), "make mpi");

  {
    REIS(REF_NULL, ref_list_free(NULL), "dont free NULL");
    RSS(ref_list_create(&ref_list), "create");
    REIS(0, ref_list_n(ref_list), "init zero");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* deep copy empty */
    REF_LIST original;
    RSS(ref_list_create(&original), "create");
    RSS(ref_list_deep_copy(&ref_list, original), "deep copy");
    RSS(ref_list_free(original), "free");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* store one */
    REF_INT item;
    RSS(ref_list_create(&ref_list), "create");
    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    REIS(1, ref_list_n(ref_list), "has one");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* remove */
    REF_INT item, last;
    RSS(ref_list_create(&ref_list), "create");

    REIS(REF_FAILURE, ref_list_pop(ref_list, &last), "rm");

    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    RSS(ref_list_pop(ref_list, &last), "rm");
    REIS(0, ref_list_n(ref_list), "has none");

    RSS(ref_list_free(ref_list), "free");
  }

  { /* store lots */
    REF_INT item, max;
    RSS(ref_list_create(&ref_list), "create");
    max = ref_list_max(ref_list);
    for (item = 0; item <= max; item++) {
      RSS(ref_list_push(ref_list, item), "store");
    }
    RAS(ref_list_max(ref_list) > max, "more?");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* erase */
    RSS(ref_list_create(&ref_list), "create");
    RSS(ref_list_push(ref_list, 20), "store");
    RSS(ref_list_push(ref_list, 10), "store");

    RSS(ref_list_erase(ref_list), "rm -rf");

    REIS(0, ref_list_n(ref_list), "has none");

    RSS(ref_list_free(ref_list), "free");
  }

  { /* contains */
    REF_INT item;
    REF_BOOL contains;
    RSS(ref_list_create(&ref_list), "create");
    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    RSS(ref_list_contains(ref_list, item, &contains), "have");
    REIS(REF_TRUE, contains, "does have");
    RSS(ref_list_contains(ref_list, 5, &contains), "have");
    REIS(REF_FALSE, contains, "does have");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* delete first */
    REF_INT item;
    RSS(ref_list_create(&ref_list), "create");

    item = 5;
    REIS(REF_NOT_FOUND, ref_list_delete(ref_list, item), "rm");

    item = 21;
    RSS(ref_list_push(ref_list, item), "add");
    item = 22;
    RSS(ref_list_push(ref_list, item), "add");
    item = 23;
    RSS(ref_list_push(ref_list, item), "add");
    REIS(3, ref_list_n(ref_list), "has 3");

    item = 21;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(2, ref_list_n(ref_list), "has 2");

    item = 23;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(1, ref_list_n(ref_list), "has 1");

    item = 22;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(0, ref_list_n(ref_list), "has 0");

    RSS(ref_list_free(ref_list), "free");
  }

  RSS(ref_mpi_free(ref_mpi), "mpi free");
  RSS(ref_mpi_stop(), "stop");

  return 0;
}